

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hpp
# Opt level: O2

bool ft::lexicographical_compare<ft::constListIterator<int>,ft::constListIterator<int>>
               (constListIterator<int> *first1,constListIterator<int> *last1,
               constListIterator<int> *first2,constListIterator<int> *last2,type *param_5,
               type *param_6)

{
  bool bVar1;
  
  bVar1 = lexicographical_compare<ft::constListIterator<int>,ft::constListIterator<int>,ft::less<int>>
                    ();
  return bVar1;
}

Assistant:

bool lexicographical_compare(Iterator1 first1, Iterator1 last1, Iterator2 first2, Iterator2 last2,
							 typename ft::_void_t<typename ft::iterator_traits<Iterator1>::iterator_category>::type * = 0,
							 typename ft::_void_t<typename ft::iterator_traits<Iterator2>::iterator_category>::type * = 0) {
	return ft::lexicographical_compare(first1, last1, first2, last2, ft::less<typename ft::iterator_traits<Iterator1>::value_type>());
}